

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O2

void __thiscall pstack::FileReader::~FileReader(FileReader *this)

{
  (this->super_Reader)._vptr_Reader = (_func_int **)&PTR__FileReader_0019b718;
  close(this->file);
  std::__cxx11::string::~string((string *)&this->name);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_Reader).super_enable_shared_from_this<pstack::Reader>._M_weak_this.
              super___weak_ptr<pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

FileReader::~FileReader()
{
    ::close(file);
}